

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

PaUtilConverter *
PaUtil_SelectConverter
          (PaSampleFormat sourceFormat,PaSampleFormat destinationFormat,PaStreamFlags flags)

{
  PaStreamFlags flags_local;
  PaSampleFormat destinationFormat_local;
  PaSampleFormat sourceFormat_local;
  PaUtilConverter *local_8;
  
  switch(sourceFormat & 0xffffffff7fffffff) {
  case 1:
    switch(destinationFormat & 0xffffffff7fffffff) {
    case 1:
      local_8 = paConverters.Copy_32_To_32;
      break;
    case 2:
      if ((flags & 1) == 0) {
        if ((flags & 2) == 0) {
          local_8 = paConverters.Float32_To_Int32_DitherClip;
        }
        else {
          local_8 = paConverters.Float32_To_Int32_Clip;
        }
      }
      else if ((flags & 2) == 0) {
        local_8 = paConverters.Float32_To_Int32_Dither;
      }
      else {
        local_8 = paConverters.Float32_To_Int32;
      }
      break;
    default:
      local_8 = (PaUtilConverter *)0x0;
      break;
    case 4:
      if ((flags & 1) == 0) {
        if ((flags & 2) == 0) {
          local_8 = paConverters.Float32_To_Int24_DitherClip;
        }
        else {
          local_8 = paConverters.Float32_To_Int24_Clip;
        }
      }
      else if ((flags & 2) == 0) {
        local_8 = paConverters.Float32_To_Int24_Dither;
      }
      else {
        local_8 = paConverters.Float32_To_Int24;
      }
      break;
    case 8:
      if ((flags & 1) == 0) {
        if ((flags & 2) == 0) {
          local_8 = paConverters.Float32_To_Int16_DitherClip;
        }
        else {
          local_8 = paConverters.Float32_To_Int16_Clip;
        }
      }
      else if ((flags & 2) == 0) {
        local_8 = paConverters.Float32_To_Int16_Dither;
      }
      else {
        local_8 = paConverters.Float32_To_Int16;
      }
      break;
    case 0x10:
      if ((flags & 1) == 0) {
        if ((flags & 2) == 0) {
          local_8 = paConverters.Float32_To_Int8_DitherClip;
        }
        else {
          local_8 = paConverters.Float32_To_Int8_Clip;
        }
      }
      else if ((flags & 2) == 0) {
        local_8 = paConverters.Float32_To_Int8_Dither;
      }
      else {
        local_8 = paConverters.Float32_To_Int8;
      }
      break;
    case 0x20:
      if ((flags & 1) == 0) {
        if ((flags & 2) == 0) {
          local_8 = paConverters.Float32_To_UInt8_DitherClip;
        }
        else {
          local_8 = paConverters.Float32_To_UInt8_Clip;
        }
      }
      else if ((flags & 2) == 0) {
        local_8 = paConverters.Float32_To_UInt8_Dither;
      }
      else {
        local_8 = paConverters.Float32_To_UInt8;
      }
    }
    break;
  case 2:
    switch(destinationFormat & 0xffffffff7fffffff) {
    case 1:
      local_8 = paConverters.Int32_To_Float32;
      break;
    case 2:
      local_8 = paConverters.Copy_32_To_32;
      break;
    default:
      local_8 = (PaUtilConverter *)0x0;
      break;
    case 4:
      if ((flags & 2) == 0) {
        local_8 = paConverters.Int32_To_Int24_Dither;
      }
      else {
        local_8 = paConverters.Int32_To_Int24;
      }
      break;
    case 8:
      if ((flags & 2) == 0) {
        local_8 = paConverters.Int32_To_Int16_Dither;
      }
      else {
        local_8 = paConverters.Int32_To_Int16;
      }
      break;
    case 0x10:
      if ((flags & 2) == 0) {
        local_8 = paConverters.Int32_To_Int8_Dither;
      }
      else {
        local_8 = paConverters.Int32_To_Int8;
      }
      break;
    case 0x20:
      if ((flags & 2) == 0) {
        local_8 = paConverters.Int32_To_UInt8_Dither;
      }
      else {
        local_8 = paConverters.Int32_To_UInt8;
      }
    }
    break;
  default:
    local_8 = (PaUtilConverter *)0x0;
    break;
  case 4:
    switch(destinationFormat & 0xffffffff7fffffff) {
    case 1:
      local_8 = paConverters.Int24_To_Float32;
      break;
    case 2:
      local_8 = paConverters.Int24_To_Int32;
      break;
    default:
      local_8 = (PaUtilConverter *)0x0;
      break;
    case 4:
      local_8 = paConverters.Copy_24_To_24;
      break;
    case 8:
      if ((flags & 2) == 0) {
        local_8 = paConverters.Int24_To_Int16_Dither;
      }
      else {
        local_8 = paConverters.Int24_To_Int16;
      }
      break;
    case 0x10:
      if ((flags & 2) == 0) {
        local_8 = paConverters.Int24_To_Int8_Dither;
      }
      else {
        local_8 = paConverters.Int24_To_Int8;
      }
      break;
    case 0x20:
      if ((flags & 2) == 0) {
        local_8 = paConverters.Int24_To_UInt8_Dither;
      }
      else {
        local_8 = paConverters.Int24_To_UInt8;
      }
    }
    break;
  case 8:
    switch(destinationFormat & 0xffffffff7fffffff) {
    case 1:
      local_8 = paConverters.Int16_To_Float32;
      break;
    case 2:
      local_8 = paConverters.Int16_To_Int32;
      break;
    default:
      local_8 = (PaUtilConverter *)0x0;
      break;
    case 4:
      local_8 = paConverters.Int16_To_Int24;
      break;
    case 8:
      local_8 = paConverters.Copy_16_To_16;
      break;
    case 0x10:
      if ((flags & 2) == 0) {
        local_8 = paConverters.Int16_To_Int8_Dither;
      }
      else {
        local_8 = paConverters.Int16_To_Int8;
      }
      break;
    case 0x20:
      if ((flags & 2) == 0) {
        local_8 = paConverters.Int16_To_UInt8_Dither;
      }
      else {
        local_8 = paConverters.Int16_To_UInt8;
      }
    }
    break;
  case 0x10:
    switch(destinationFormat & 0xffffffff7fffffff) {
    case 1:
      local_8 = paConverters.Int8_To_Float32;
      break;
    case 2:
      local_8 = paConverters.Int8_To_Int32;
      break;
    default:
      local_8 = (PaUtilConverter *)0x0;
      break;
    case 4:
      local_8 = paConverters.Int8_To_Int24;
      break;
    case 8:
      local_8 = paConverters.Int8_To_Int16;
      break;
    case 0x10:
      local_8 = paConverters.Copy_8_To_8;
      break;
    case 0x20:
      local_8 = paConverters.Int8_To_UInt8;
    }
    break;
  case 0x20:
    switch(destinationFormat & 0xffffffff7fffffff) {
    case 1:
      local_8 = paConverters.UInt8_To_Float32;
      break;
    case 2:
      local_8 = paConverters.UInt8_To_Int32;
      break;
    default:
      local_8 = (PaUtilConverter *)0x0;
      break;
    case 4:
      local_8 = paConverters.UInt8_To_Int24;
      break;
    case 8:
      local_8 = paConverters.UInt8_To_Int16;
      break;
    case 0x10:
      local_8 = paConverters.UInt8_To_Int8;
      break;
    case 0x20:
      local_8 = paConverters.Copy_8_To_8;
    }
  }
  return local_8;
}

Assistant:

PaUtilConverter* PaUtil_SelectConverter( PaSampleFormat sourceFormat,
        PaSampleFormat destinationFormat, PaStreamFlags flags )
{
    PA_SELECT_FORMAT_( sourceFormat,
                       /* paFloat32: */
                       PA_SELECT_FORMAT_( destinationFormat,
                                          /* paFloat32: */        PA_UNITY_CONVERSION_( 32 ),
                                          /* paInt32: */          PA_SELECT_CONVERTER_DITHER_CLIP_( flags, Float32, Int32 ),
                                          /* paInt24: */          PA_SELECT_CONVERTER_DITHER_CLIP_( flags, Float32, Int24 ),
                                          /* paInt16: */          PA_SELECT_CONVERTER_DITHER_CLIP_( flags, Float32, Int16 ),
                                          /* paInt8: */           PA_SELECT_CONVERTER_DITHER_CLIP_( flags, Float32, Int8 ),
                                          /* paUInt8: */          PA_SELECT_CONVERTER_DITHER_CLIP_( flags, Float32, UInt8 )
                                        ),
                       /* paInt32: */
                       PA_SELECT_FORMAT_( destinationFormat,
                                          /* paFloat32: */        PA_USE_CONVERTER_( Int32, Float32 ),
                                          /* paInt32: */          PA_UNITY_CONVERSION_( 32 ),
                                          /* paInt24: */          PA_SELECT_CONVERTER_DITHER_( flags, Int32, Int24 ),
                                          /* paInt16: */          PA_SELECT_CONVERTER_DITHER_( flags, Int32, Int16 ),
                                          /* paInt8: */           PA_SELECT_CONVERTER_DITHER_( flags, Int32, Int8 ),
                                          /* paUInt8: */          PA_SELECT_CONVERTER_DITHER_( flags, Int32, UInt8 )
                                        ),
                       /* paInt24: */
                       PA_SELECT_FORMAT_( destinationFormat,
                                          /* paFloat32: */        PA_USE_CONVERTER_( Int24, Float32 ),
                                          /* paInt32: */          PA_USE_CONVERTER_( Int24, Int32 ),
                                          /* paInt24: */          PA_UNITY_CONVERSION_( 24 ),
                                          /* paInt16: */          PA_SELECT_CONVERTER_DITHER_( flags, Int24, Int16 ),
                                          /* paInt8: */           PA_SELECT_CONVERTER_DITHER_( flags, Int24, Int8 ),
                                          /* paUInt8: */          PA_SELECT_CONVERTER_DITHER_( flags, Int24, UInt8 )
                                        ),
                       /* paInt16: */
                       PA_SELECT_FORMAT_( destinationFormat,
                                          /* paFloat32: */        PA_USE_CONVERTER_( Int16, Float32 ),
                                          /* paInt32: */          PA_USE_CONVERTER_( Int16, Int32 ),
                                          /* paInt24: */          PA_USE_CONVERTER_( Int16, Int24 ),
                                          /* paInt16: */          PA_UNITY_CONVERSION_( 16 ),
                                          /* paInt8: */           PA_SELECT_CONVERTER_DITHER_( flags, Int16, Int8 ),
                                          /* paUInt8: */          PA_SELECT_CONVERTER_DITHER_( flags, Int16, UInt8 )
                                        ),
                       /* paInt8: */
                       PA_SELECT_FORMAT_( destinationFormat,
                                          /* paFloat32: */        PA_USE_CONVERTER_( Int8, Float32 ),
                                          /* paInt32: */          PA_USE_CONVERTER_( Int8, Int32 ),
                                          /* paInt24: */          PA_USE_CONVERTER_( Int8, Int24 ),
                                          /* paInt16: */          PA_USE_CONVERTER_( Int8, Int16 ),
                                          /* paInt8: */           PA_UNITY_CONVERSION_( 8 ),
                                          /* paUInt8: */          PA_USE_CONVERTER_( Int8, UInt8 )
                                        ),
                       /* paUInt8: */
                       PA_SELECT_FORMAT_( destinationFormat,
                                          /* paFloat32: */        PA_USE_CONVERTER_( UInt8, Float32 ),
                                          /* paInt32: */          PA_USE_CONVERTER_( UInt8, Int32 ),
                                          /* paInt24: */          PA_USE_CONVERTER_( UInt8, Int24 ),
                                          /* paInt16: */          PA_USE_CONVERTER_( UInt8, Int16 ),
                                          /* paInt8: */           PA_USE_CONVERTER_( UInt8, Int8 ),
                                          /* paUInt8: */          PA_UNITY_CONVERSION_( 8 )
                                        )
                     )
}